

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ru_vine_swap.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
RU_vine_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true>_>_>
::_swap_at_index(RU_vine_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true>_>_>
                 *this,Index columnIndex)

{
  _Prime_rehash_policy *this_00;
  __node_base_ptr *this_01;
  __node_base_ptr p_Var1;
  node_ptr plVar2;
  node_ptr other_node;
  undefined4 uVar3;
  uint uVar4;
  size_type sVar5;
  iterator iVar6;
  _List_node_base *p_Var7;
  __node_base_ptr p_Var8;
  _Hash_node_base *p_Var9;
  node_ptr plVar10;
  node_ptr plVar11;
  node_ptr plVar12;
  iterator iVar13;
  long lVar14;
  __node_base_ptr p_Var15;
  key_type *pkVar16;
  ulong uVar17;
  key_type kVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  Index local_6c;
  ulong local_68;
  uint local_5c;
  long local_58;
  long local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  uVar19 = (ulong)columnIndex;
  sVar5 = this[1].super_type.indexToBar_._M_h._M_bucket_count;
  uVar17 = ((long)((long)this[1].super_type.indexToBar_._M_h._M_before_begin._M_nxt - sVar5) >> 3) *
           -0x3333333333333333;
  uVar20 = uVar19;
  if (uVar19 <= uVar17 && uVar17 - uVar19 != 0) {
    uVar21 = columnIndex + 1;
    uVar20 = (ulong)uVar21;
    if (uVar20 <= uVar17 && uVar17 - uVar20 != 0) {
      local_58 = uVar19 * 5;
      local_50 = uVar20 * 5;
      plVar2 = (node_ptr)(sVar5 + 0x18 + uVar19 * 0x28);
      uVar3 = *(undefined4 *)&plVar2[-2].prev_;
      other_node = (node_ptr)(sVar5 + 0x18 + uVar20 * 0x28);
      *(undefined4 *)&plVar2[-2].prev_ = *(undefined4 *)&other_node[-2].prev_;
      *(undefined4 *)&other_node[-2].prev_ = uVar3;
      local_48 = uVar20;
      local_38 = uVar19;
      boost::intrusive::circular_list_algorithms<boost::intrusive::list_node_traits<void_*>_>::
      swap_nodes(plVar2,other_node);
      plVar10 = plVar2[-1].next_;
      plVar11 = plVar2[-1].prev_;
      plVar12 = other_node[-1].prev_;
      plVar2[-1].next_ = other_node[-1].next_;
      plVar2[-1].prev_ = plVar12;
      other_node[-1].next_ = plVar10;
      other_node[-1].prev_ = plVar11;
      local_6c = columnIndex;
      iVar13 = std::
               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)this,&local_6c);
      pkVar16 = (key_type *)
                ((long)iVar13.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                       ._M_cur + 0xc);
      if (iVar13.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
          _M_cur == (__node_type *)0x0) {
        pkVar16 = &local_6c;
      }
      local_68 = (ulong)columnIndex;
      uVar4 = *pkVar16;
      local_6c = uVar21;
      local_5c = uVar21;
      iVar13 = std::
               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)this,&local_6c);
      pkVar16 = (key_type *)
                ((long)iVar13.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                       ._M_cur + 0xc);
      if (iVar13.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
          _M_cur == (__node_type *)0x0) {
        pkVar16 = &local_6c;
      }
      uVar21 = *pkVar16;
      uVar17 = (ulong)uVar21;
      *(undefined1 *)&this[1].super_type.indexToBar_._M_h._M_buckets = 1;
      lVar14 = *(long *)&this[1].super_type.super_type.map_._M_h._M_rehash_policy;
      uVar20 = (long)(this[1].super_type.super_type.map_._M_h._M_rehash_policy._M_next_resize -
                     lVar14) >> 2;
      if (uVar21 < uVar4) {
        uVar21 = uVar4;
      }
      kVar18 = (key_type)local_68;
      local_40 = (ulong)uVar4;
      if (uVar20 <= uVar21) {
        this_00 = &this[1].super_type.super_type.map_._M_h._M_rehash_policy;
        do {
          local_6c = (Index)uVar20;
          iVar6._M_current =
               (uint *)this[1].super_type.super_type.map_._M_h._M_rehash_policy._M_next_resize;
          if ((__node_base_ptr)iVar6._M_current ==
              this[1].super_type.super_type.map_._M_h._M_single_bucket) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,iVar6,
                       &local_6c);
          }
          else {
            *iVar6._M_current = local_6c;
            this[1].super_type.super_type.map_._M_h._M_rehash_policy._M_next_resize =
                 (size_t)(iVar6._M_current + 1);
          }
          uVar20 = uVar20 + 1;
        } while ((ulong)uVar21 + 1 != uVar20);
        lVar14 = *(long *)this_00;
        kVar18 = (key_type)local_68;
      }
      uVar20 = (ulong)*(uint *)(lVar14 + local_40 * 4);
      p_Var7 = this[1].super_type.barcode_.
               super__List_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
               ._M_impl._M_node.super__List_node_base._M_next;
      uVar19 = (ulong)*(uint *)(lVar14 + uVar17 * 4);
      uVar3 = *(undefined4 *)((long)&p_Var7->_M_next + uVar20 * 4);
      *(undefined4 *)((long)&p_Var7->_M_next + uVar20 * 4) =
           *(undefined4 *)((long)&p_Var7->_M_next + uVar19 * 4);
      *(undefined4 *)((long)&p_Var7->_M_next + uVar19 * 4) = uVar3;
      uVar3 = *(undefined4 *)(lVar14 + local_40 * 4);
      *(undefined4 *)(lVar14 + local_40 * 4) = *(undefined4 *)(lVar14 + uVar17 * 4);
      *(undefined4 *)(lVar14 + uVar17 * 4) = uVar3;
      p_Var8 = this[1].super_type.idToPosition_._M_h._M_single_bucket;
      uVar17 = ((long)this[2].super_type.super_type.map_._M_h._M_buckets - (long)p_Var8 >> 3) *
               -0x3333333333333333;
      uVar20 = local_38;
      if ((local_38 <= uVar17 && uVar17 - local_38 != 0) &&
         (uVar20 = local_48, local_48 <= uVar17 && uVar17 - local_48 != 0)) {
        p_Var1 = p_Var8 + local_58;
        uVar3 = *(undefined4 *)&p_Var1->_M_nxt;
        plVar2 = (node_ptr)(p_Var8 + local_50 + 3);
        *(undefined4 *)&p_Var1->_M_nxt = *(undefined4 *)&plVar2[-2].prev_;
        *(undefined4 *)&plVar2[-2].prev_ = uVar3;
        boost::intrusive::circular_list_algorithms<boost::intrusive::list_node_traits<void_*>_>::
        swap_nodes((node_ptr)(p_Var1 + 3),plVar2);
        plVar10 = (node_ptr)p_Var1[1]._M_nxt;
        plVar11 = (node_ptr)p_Var1[2]._M_nxt;
        plVar12 = plVar2[-1].prev_;
        p_Var1[1]._M_nxt = (_Hash_node_base *)plVar2[-1].next_;
        p_Var1[2]._M_nxt = (_Hash_node_base *)plVar12;
        plVar2[-1].next_ = plVar10;
        plVar2[-1].prev_ = plVar11;
        local_6c = kVar18;
        iVar13 = std::
                 _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)this,&local_6c);
        pkVar16 = (key_type *)
                  ((long)iVar13.
                         super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                         ._M_cur + 0xc);
        if (iVar13.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
            _M_cur == (__node_type *)0x0) {
          pkVar16 = &local_6c;
        }
        uVar21 = *pkVar16;
        local_6c = local_5c;
        iVar13 = std::
                 _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)this,&local_6c);
        pkVar16 = (key_type *)
                  ((long)iVar13.
                         super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                         ._M_cur + 0xc);
        if (iVar13.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
            _M_cur == (__node_type *)0x0) {
          pkVar16 = &local_6c;
        }
        uVar4 = *pkVar16;
        uVar19 = (ulong)uVar4;
        *(undefined1 *)&this[1].super_type.idToPosition_._M_h._M_rehash_policy._M_next_resize = 1;
        p_Var15 = this[1].super_type.indexToBar_._M_h._M_single_bucket;
        uVar17 = (long)this[1].super_type.idToPosition_._M_h._M_buckets - (long)p_Var15 >> 2;
        uVar20 = uVar19;
        if (uVar4 < uVar21) {
          uVar20 = (ulong)uVar21;
        }
        local_68 = (ulong)uVar21;
        if (uVar17 <= uVar20) {
          this_01 = &this[1].super_type.indexToBar_._M_h._M_single_bucket;
          do {
            local_6c = (Index)uVar17;
            iVar6._M_current = (uint *)this[1].super_type.idToPosition_._M_h._M_buckets;
            if (iVar6._M_current == (uint *)this[1].super_type.idToPosition_._M_h._M_bucket_count) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01,iVar6,
                         &local_6c);
            }
            else {
              *iVar6._M_current = local_6c;
              this[1].super_type.idToPosition_._M_h._M_buckets =
                   (__buckets_ptr)(iVar6._M_current + 1);
            }
            uVar17 = uVar17 + 1;
          } while (uVar20 + 1 != uVar17);
          p_Var15 = *this_01;
        }
        uVar20 = (ulong)*(uint *)((long)&p_Var15->_M_nxt + local_68 * 4);
        p_Var9 = this[1].super_type.idToPosition_._M_h._M_before_begin._M_nxt;
        uVar17 = (ulong)*(uint *)((long)&p_Var15->_M_nxt + uVar19 * 4);
        uVar3 = *(undefined4 *)((long)&p_Var9->_M_nxt + uVar20 * 4);
        *(undefined4 *)((long)&p_Var9->_M_nxt + uVar20 * 4) =
             *(undefined4 *)((long)&p_Var9->_M_nxt + uVar17 * 4);
        *(undefined4 *)((long)&p_Var9->_M_nxt + uVar17 * 4) = uVar3;
        uVar3 = *(undefined4 *)((long)&p_Var15->_M_nxt + local_68 * 4);
        *(undefined4 *)((long)&p_Var15->_M_nxt + local_68 * 4) =
             *(undefined4 *)((long)&p_Var15->_M_nxt + uVar19 * 4);
        *(undefined4 *)((long)&p_Var15->_M_nxt + uVar19 * 4) = uVar3;
        return;
      }
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar20);
}

Assistant:

inline void RU_vine_swap<Master_matrix>::_swap_at_index(Index columnIndex)
{
  _matrix()->reducedMatrixR_.swap_columns(columnIndex, columnIndex + 1);
  _matrix()->reducedMatrixR_.swap_rows(_get_row_id_from_position(columnIndex),
                                       _get_row_id_from_position(columnIndex + 1));
  _matrix()->mirrorMatrixU_.swap_columns(columnIndex, columnIndex + 1);
  _matrix()->mirrorMatrixU_.swap_rows(_get_row_id_from_position(columnIndex),
                                      _get_row_id_from_position(columnIndex + 1));
}